

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_fnmatch(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  u8 *zPattern;
  u8 *zString;
  anon_union_8_3_18420de5_for_x aVar2;
  jx9_value *pjVar3;
  uint noCase;
  
  if (((nArg < 2) || (((*apArg)->iFlags & 1) == 0)) || ((apArg[1]->iFlags & 1) == 0)) {
    pjVar3 = pCtx->pRet;
    jx9MemObjRelease(pjVar3);
    (pjVar3->x).rVal = 0.0;
  }
  else {
    zPattern = (u8 *)jx9_value_to_string(*apArg,(int *)0x0);
    zString = (u8 *)jx9_value_to_string(apArg[1],(int *)0x0);
    iVar1 = 0x5c;
    noCase = 0;
    if ((nArg != 2) && (pjVar3 = apArg[2], noCase = 0, (pjVar3->iFlags & 2) != 0)) {
      jx9MemObjToInteger(pjVar3);
      iVar1 = 0x5c;
      if ((*(uint *)&pjVar3->x & 1) != 0) {
        iVar1 = 0;
      }
      noCase = *(uint *)&pjVar3->x >> 3 & 1;
    }
    iVar1 = patternCompare(zPattern,zString,iVar1,noCase);
    pjVar3 = pCtx->pRet;
    jx9MemObjRelease(pjVar3);
    aVar2.iVal._1_7_ = 0;
    aVar2.iVal._0_1_ = iVar1 != 0;
    pjVar3->x = aVar2;
  }
  pjVar3->iFlags = pjVar3->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_fnmatch(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zPattern;
	int iEsc = '\\';
	int noCase = 0;
	int rc;
	if( nArg < 2 || !jx9_value_is_string(apArg[0]) || !jx9_value_is_string(apArg[1]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the pattern and the string */
	zPattern  = jx9_value_to_string(apArg[0], 0);
	zString = jx9_value_to_string(apArg[1], 0);
	/* Extract the flags if avaialble */
	if( nArg > 2 && jx9_value_is_int(apArg[2]) ){
		rc = jx9_value_to_int(apArg[2]);
		if( rc & 0x01 /*FNM_NOESCAPE*/){
			iEsc = 0;
		}
		if( rc & 0x08 /*FNM_CASEFOLD*/){
			noCase = 1;
		}
	}
	/* Go globbing */
	rc = Glob((const unsigned char *)zPattern, (const unsigned char *)zString, iEsc, noCase);
	/* Globbing result */
	jx9_result_bool(pCtx, rc);
	return JX9_OK;
}